

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int send_finished(ptls_t *tls,ptls_buffer_t *sendbuf)

{
  uint8_t *puVar1;
  size_t rec_start;
  uint8_t *puVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  st_ptls_hash_context_t *psVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  
  rec_start = sendbuf->off;
  iVar7 = ptls_buffer_reserve(sendbuf,3);
  if (iVar7 == 0) {
    puVar2 = sendbuf->base;
    sVar3 = sendbuf->off;
    puVar1 = puVar2 + sVar3;
    puVar1[0] = '\x16';
    puVar1[1] = '\x03';
    puVar2[sVar3 + 2] = '\x01';
    sendbuf->off = sendbuf->off + 3;
    iVar7 = ptls_buffer_reserve(sendbuf,2);
    if (iVar7 == 0) {
      puVar1 = sendbuf->base;
      sVar3 = sendbuf->off;
      (puVar1 + sVar3)[0] = '\0';
      (puVar1 + sVar3)[1] = '\0';
      sVar4 = sendbuf->off;
      sVar3 = sVar4 + 2;
      sendbuf->off = sVar3;
      iVar7 = ptls_buffer_reserve(sendbuf,1);
      if (iVar7 == 0) {
        sendbuf->base[sendbuf->off] = '\x14';
        sendbuf->off = sendbuf->off + 1;
        iVar7 = ptls_buffer_reserve(sendbuf,3);
        if (iVar7 == 0) {
          puVar1 = sendbuf->base;
          sVar5 = sendbuf->off;
          puVar1[sVar5 + 2] = '\0';
          puVar1 = puVar1 + sVar5;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          sVar10 = sendbuf->off;
          sVar5 = sVar10 + 3;
          sendbuf->off = sVar5;
          iVar7 = ptls_buffer_reserve(sendbuf,tls->key_schedule->algo->digest_size);
          if (iVar7 == 0) {
            iVar7 = calc_verify_data(sendbuf->base + sendbuf->off,tls->key_schedule,
                                     &(tls->traffic_protection).enc);
            if (iVar7 == 0) {
              sVar8 = sendbuf->off + tls->key_schedule->algo->digest_size;
              sendbuf->off = sVar8;
              lVar9 = 0x10;
              do {
                sendbuf->base[sVar10] = (uint8_t)(sVar8 - sVar5 >> ((byte)lVar9 & 0x3f));
                lVar9 = lVar9 + -8;
                sVar10 = sVar10 + 1;
              } while (lVar9 != -8);
              if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
                psVar6 = tls->key_schedule->msghash;
                (*psVar6->update)(psVar6,sendbuf->base + sVar3,sendbuf->off - sVar3);
              }
              lVar9 = sendbuf->off - sVar3;
              sendbuf->base[sVar4] = (uint8_t)((ulong)lVar9 >> 8);
              sendbuf->base[sVar4 + 1] = (uint8_t)lVar9;
              iVar7 = buffer_encrypt_record(sendbuf,rec_start,(tls->traffic_protection).enc.aead);
              return iVar7;
            }
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

static int send_finished(ptls_t *tls, ptls_buffer_t *sendbuf)
{
    int ret;

    buffer_encrypt(sendbuf, tls->traffic_protection.enc.aead, {
        buffer_push_handshake(sendbuf, tls->key_schedule, PTLS_HANDSHAKE_TYPE_FINISHED, {
            if ((ret = ptls_buffer_reserve(sendbuf, tls->key_schedule->algo->digest_size)) != 0)
                goto Exit;
            if ((ret = calc_verify_data(sendbuf->base + sendbuf->off, tls->key_schedule, tls->traffic_protection.enc.secret)) != 0)
                goto Exit;
            sendbuf->off += tls->key_schedule->algo->digest_size;
        });
    });

Exit:
    return ret;
}